

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DiagObjectModel.cpp
# Opt level: O0

BOOL __thiscall
Js::RecyclableCollectionObjectWalker<Js::JavascriptSet>::Get
          (RecyclableCollectionObjectWalker<Js::JavascriptSet> *this,int i,
          ResolvedObject *pResolvedObject)

{
  StringBuilder<Memory::ArenaAllocator> *this_00;
  Var aValue;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  ThreadContext *this_01;
  DebugManager *pDVar4;
  char16 *pcVar5;
  undefined4 *puVar6;
  RecyclableObject *this_02;
  IDiagObjectModelDisplay *pIVar7;
  StringBuilder<Memory::ArenaAllocator> *builder;
  ResolvedObject *pResolvedObject_local;
  int i_local;
  RecyclableCollectionObjectWalker<Js::JavascriptSet> *this_local;
  TypeId local_18;
  TypeId typeId;
  
  this_01 = ScriptContext::GetThreadContext(this->scriptContext);
  pDVar4 = ThreadContext::GetDebugManager(this_01);
  this_00 = pDVar4->pCurrentInterpreterLocation->stringBuilder;
  StringBuilder<Memory::ArenaAllocator>::Reset(this_00);
  StringBuilder<Memory::ArenaAllocator>::AppendUint64(this_00,(long)i);
  pcVar5 = StringBuilder<Memory::ArenaAllocator>::Detach(this_00);
  pResolvedObject->name = pcVar5;
  pResolvedObject->propId = -1;
  pResolvedObject->obj = this->instance;
  pResolvedObject->scriptContext = this->scriptContext;
  aValue = pResolvedObject->obj;
  if (aValue == (Var)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                ,0x14,"(aValue != nullptr)","GetTypeId aValue is null");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar6 = 0;
  }
  bVar2 = TaggedInt::Is(aValue);
  if (bVar2) {
    local_18 = TypeIds_FirstNumberType;
  }
  else {
    bVar2 = JavascriptNumber::Is_NoTaggedIntCheck(aValue);
    if (bVar2) {
      local_18 = TypeIds_Number;
    }
    else {
      this_02 = UnsafeVarTo<Js::RecyclableObject>(aValue);
      if (this_02 == (RecyclableObject *)0x0) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xb,"(obj != nullptr)","GetTypeId aValue is null");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
      local_18 = RecyclableObject::GetTypeId(this_02);
      if ((0x57 < (int)local_18) && (BVar3 = RecyclableObject::IsExternal(this_02), BVar3 == 0)) {
        AssertCount = AssertCount + 1;
        Throw::LogAssert();
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 1;
        bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/./Language/JavascriptOperators.inl"
                                    ,0xe,"(typeId < TypeIds_Limit || obj->IsExternal())",
                                    "GetTypeId aValue has invalid TypeId");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar6 = 0;
      }
    }
  }
  pResolvedObject->typeId = local_18;
  pResolvedObject->address = (IDiagObjectAddress *)0x0;
  pIVar7 = CreateTDataDisplay(this,pResolvedObject,i);
  pResolvedObject->objectDisplay = pIVar7;
  return 1;
}

Assistant:

BOOL RecyclableCollectionObjectWalker<TData>::Get(int i, ResolvedObject* pResolvedObject)
    {
        auto builder = scriptContext->GetThreadContext()->GetDebugManager()->pCurrentInterpreterLocation->stringBuilder;
        builder->Reset();
        builder->AppendUint64(i);
        pResolvedObject->name = builder->Detach();
        pResolvedObject->propId = Constants::NoProperty;
        pResolvedObject->obj = instance;
        pResolvedObject->scriptContext = scriptContext;
        pResolvedObject->typeId = JavascriptOperators::GetTypeId(pResolvedObject->obj);
        pResolvedObject->address = nullptr;

        pResolvedObject->objectDisplay = CreateTDataDisplay(pResolvedObject, i);

        return TRUE;
    }